

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

Node * wasm::DataFlow::Node::makeZext(Node *child,Expression *origin)

{
  Node *this;
  Node *ret;
  Expression *origin_local;
  Node *child_local;
  
  this = (Node *)operator_new(0x30);
  Node(this,Zext);
  addValue(this,child);
  this->origin = origin;
  return this;
}

Assistant:

static Node* makeZext(Node* child, Expression* origin) {
    Node* ret = new Node(Zext);
    ret->addValue(child);
    ret->origin = origin;
    return ret;
  }